

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmCommand *this_00;
  cmCTestRunScriptCommand *ni;
  cmCTestRunScriptCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x40);
  cmCTestRunScriptCommand((cmCTestRunScriptCommand *)this_00);
  this_00[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  this_00[1].Makefile = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }